

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadTableSection(BinaryReader *this,Offset section_size)

{
  Index IVar1;
  int iVar2;
  Result RVar3;
  char *format;
  uint uVar4;
  Index num_tables;
  Type elem_type;
  Limits elem_limits;
  uint local_54;
  Type local_50;
  Limits local_48;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1c])();
  if (iVar2 == 0) {
    RVar3 = ReadCount(this,&local_54,"table count");
    if (RVar3.enum_ != Error) {
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1d])(this->delegate_,(ulong)local_54);
      if (iVar2 == 0) {
        if (local_54 != 0) {
          uVar4 = 0;
          do {
            IVar1 = this->num_table_imports_;
            local_48.initial = 0;
            local_48.max._0_7_ = 0;
            local_48._15_4_ = 0;
            RVar3 = ReadTable(this,&local_50,&local_48);
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1e])
                              (this->delegate_,(ulong)(IVar1 + uVar4),local_50,&local_48);
            if (iVar2 != 0) {
              format = "OnTable callback failed";
              goto LAB_0015517a;
            }
            uVar4 = uVar4 + 1;
          } while (local_54 != uVar4);
        }
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1f])();
        if (iVar2 == 0) {
          return (Result)Ok;
        }
        format = "EndTableSection callback failed";
      }
      else {
        format = "OnTableCount callback failed";
      }
LAB_0015517a:
      PrintError(this,format);
    }
  }
  else {
    PrintError(this,"BeginTableSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTableSection(Offset section_size) {
  CALLBACK(BeginTableSection, section_size);
  Index num_tables;
  CHECK_RESULT(ReadCount(&num_tables, "table count"));
  CALLBACK(OnTableCount, num_tables);
  for (Index i = 0; i < num_tables; ++i) {
    Index table_index = num_table_imports_ + i;
    Type elem_type;
    Limits elem_limits;
    CHECK_RESULT(ReadTable(&elem_type, &elem_limits));
    CALLBACK(OnTable, table_index, elem_type, &elem_limits);
  }
  CALLBACK0(EndTableSection);
  return Result::Ok;
}